

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mau.cpp
# Opt level: O1

MauResult mau_proxy_destroy(MauProxy proxy)

{
  MauResult MVar1;
  
  if (proxy == (MauProxy)0x0) {
    MVar1 = Mau_Success;
  }
  else {
    MVar1 = *(MauResult *)(proxy + 0x260);
    mau::ProxySession::Shutdown((ProxySession *)proxy);
    mau::ProxySession::~ProxySession((ProxySession *)proxy);
    operator_delete(proxy);
    DecrementLoggerRefs();
  }
  return MVar1;
}

Assistant:

MAU_EXPORT MauResult mau_proxy_destroy(
    MauProxy proxy ///< [in] Proxy to shutdown
)
{
    MauResult result = Mau_Success;

    auto session = reinterpret_cast<ProxySession*>(proxy);
    if (session)
    {
        result = session->GetLastResult();

        session->Shutdown();

        // Object goes out of scope here----------------------------------------
        delete session;

        DecrementLoggerRefs();
    }

    return result;
}